

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptReflect.cpp
# Opt level: O3

Var Js::JavascriptReflect::EntryDefineProperty(RecyclableObject *function,CallInfo callInfo,...)

{
  Type TVar1;
  ScriptContext *pSVar2;
  JavascriptBoolean *pJVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  BOOL BVar7;
  int iVar8;
  undefined4 *puVar9;
  Var pvVar10;
  RecyclableObject *argument;
  RecyclableObject *pRVar11;
  PropertyRecord *pPVar12;
  int in_stack_00000010;
  undefined1 local_b8 [8];
  PropertyDescriptor propertyDescriptor;
  undefined1 local_78 [8];
  AutoTagNativeLibraryEntry __tag;
  CallInfo callInfo_local;
  PropertyRecord *propertyRecord;
  ArgumentReader args;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  __tag.entry.next = (Entry *)callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptReflect.cpp"
                                ,0xd,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar5) goto LAB_00d002f3;
    *puVar9 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  propertyRecord = (PropertyRecord *)callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&propertyRecord,(CallInfo *)&__tag.entry.next);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  pRVar11 = (((pSVar2->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
            undefinedValue.ptr;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_78,function,(CallInfo)__tag.entry.next,
             L"Reflect.defineProperty",&stack0x00000000);
  uVar6 = (uint)propertyRecord;
  if (((ulong)propertyRecord & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptReflect.cpp"
                                ,0x12,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar5) goto LAB_00d002f3;
    *puVar9 = 0;
    uVar6 = (uint)propertyRecord;
  }
  if ((uVar6 >> 0x18 & 1) != 0) {
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ebf5,L"Reflect.defineProperty");
  }
  if ((uVar6 & 0xfffffe) == 0) {
LAB_00d002df:
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ec36,L"Reflect.defineProperty");
  }
  pvVar10 = Arguments::operator[]((Arguments *)&propertyRecord,1);
  BVar7 = JavascriptOperators::IsObject(pvVar10);
  if (BVar7 == 0) goto LAB_00d002df;
  pvVar10 = Arguments::operator[]((Arguments *)&propertyRecord,1);
  argument = pRVar11;
  if (2 < ((uint)propertyRecord & 0xffffff)) {
    argument = (RecyclableObject *)Arguments::operator[]((Arguments *)&propertyRecord,2);
  }
  JavascriptConversion::ToPropertyKey
            (argument,pSVar2,(PropertyRecord **)&callInfo_local,(PropertyString **)0x0);
  if (((ulong)propertyRecord & 0xfffffc) != 0) {
    pRVar11 = (RecyclableObject *)Arguments::operator[]((Arguments *)&propertyRecord,3);
  }
  PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_b8);
  BVar7 = JavascriptOperators::ToPropertyDescriptor(pRVar11,(PropertyDescriptor *)local_b8,pSVar2);
  if (BVar7 == 0) {
    pPVar12 = ScriptContext::GetPropertyName(pSVar2,*(PropertyId *)((long)callInfo_local + 8));
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ec2c,(PCWSTR)(pPVar12 + 1));
  }
  if (pvVar10 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar5) goto LAB_00d002f3;
    *puVar9 = 0;
LAB_00d00185:
    pRVar11 = UnsafeVarTo<Js::RecyclableObject>(pvVar10);
    if (pRVar11 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar5) goto LAB_00d002f3;
      *puVar9 = 0;
    }
    TVar1 = ((pRVar11->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if (TVar1 == TypeIds_HostDispatch) {
        pRVar11 = VarTo<Js::RecyclableObject>(pvVar10);
        pPVar12 = propertyRecord;
        propertyDescriptor.Configurable = propertyRecord._0_1_;
        propertyDescriptor.fromProxy = propertyRecord._1_1_;
        propertyDescriptor._42_2_ = propertyRecord._2_2_;
        propertyDescriptor._44_4_ = propertyRecord._4_4_;
        propertyRecord = pPVar12;
        iVar8 = (*(pRVar11->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x55])
                          (pRVar11,EntryDefineProperty,&propertyDescriptor.Configurable,0);
        goto LAB_00d002ae;
      }
    }
    else {
      BVar7 = RecyclableObject::IsExternal(pRVar11);
      if (BVar7 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        goto LAB_00d0027f;
      }
    }
  }
  else if (((ulong)pvVar10 & 0x1ffff00000000) == 0x1000000000000 ||
           ((ulong)pvVar10 & 0xffff000000000000) != 0x1000000000000) {
    if ((ulong)pvVar10 >> 0x32 == 0 && ((ulong)pvVar10 & 0xffff000000000000) != 0x1000000000000)
    goto LAB_00d00185;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
LAB_00d0027f:
    if (bVar5 == false) {
LAB_00d002f3:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar9 = 0;
  }
  pRVar11 = VarTo<Js::RecyclableObject>(pvVar10);
  iVar8 = JavascriptObject::DefineOwnPropertyHelper
                    (pRVar11,*(PropertyId *)((long)callInfo_local + 8),
                     (PropertyDescriptor *)local_b8,pSVar2,false);
LAB_00d002ae:
  pJVar3 = (&(((pSVar2->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             booleanTrue)[iVar8 == 0].ptr;
  AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_78);
  return pJVar3;
}

Assistant:

Var JavascriptReflect::EntryDefineProperty(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        Var undefinedValue = scriptContext->GetLibrary()->GetUndefined();
        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Reflect.defineProperty"));

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        if  (args.Info.Flags & CallFlags_New)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_ErrorOnNew, _u("Reflect.defineProperty"));
        }

        Var propertyKey, attributes;
        if (args.Info.Count < 2 || !JavascriptOperators::IsObject(args[1]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("Reflect.defineProperty"));
        }
        Var target = args[1];

        propertyKey = args.Info.Count > 2 ? args[2] : undefinedValue;
        PropertyRecord const * propertyRecord;
        JavascriptConversion::ToPropertyKey(propertyKey, scriptContext, &propertyRecord, nullptr);

        attributes = args.Info.Count > 3 ? args[3] : undefinedValue;
        PropertyDescriptor propertyDescriptor;
        if (!JavascriptOperators::ToPropertyDescriptor(attributes, &propertyDescriptor, scriptContext))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_PropertyDescriptor_Invalid, scriptContext->GetPropertyName(propertyRecord->GetPropertyId())->GetBuffer());
        }

        // If the object is HostDispatch try to invoke the operation remotely
        BOOL defineResult;
        if (JavascriptOperators::GetTypeId(target) == TypeIds_HostDispatch)
        {
            defineResult = VarTo<RecyclableObject>(target)->InvokeBuiltInOperationRemotely(EntryDefineProperty, args, nullptr);
        }
        else
        {
            defineResult = JavascriptObject::DefineOwnPropertyHelper(VarTo<RecyclableObject>(target), propertyRecord->GetPropertyId(), propertyDescriptor, scriptContext, false);
        }

        return scriptContext->GetLibrary()->GetTrueOrFalse(defineResult);
    }